

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::NullTypeHandlerBase::HasProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,bool *noRedecl,
          PropertyValueInfo *info)

{
  ScriptContext *this_00;
  bool bVar1;
  BOOL BVar2;
  BOOL BVar3;
  undefined8 in_RAX;
  uint32 local_34 [2];
  uint32 indexVal;
  
  local_34[0] = (uint32)((ulong)in_RAX >> 0x20);
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  if (noRedecl != (bool *)0x0) {
    *noRedecl = false;
  }
  bVar1 = DynamicObject::HasObjectArray(instance);
  BVar3 = 0;
  if (bVar1) {
    BVar2 = ScriptContext::IsNumericPropertyId(this_00,propertyId,local_34);
    BVar3 = 0;
    if (BVar2 != 0) {
      BVar3 = DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance,local_34[0]);
    }
  }
  return BVar3;
}

Assistant:

BOOL NullTypeHandlerBase::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        // Check numeric propertyId only if objectArray is available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();

        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return DynamicTypeHandler::HasItem(instance, indexVal);
        }

        return false;
    }